

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geodesic.cpp
# Opt level: O0

Geodesic * Geodesic::getGeodesic(PhyloTree *t1,PhyloTree *t2)

{
  bool bVar1;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *t2_edges_00;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *dest;
  size_type sVar2;
  size_type sVar3;
  invalid_argument *piVar4;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *pvVar5;
  vector<PhyloTree,_std::allocator<PhyloTree>_> *pvVar6;
  long in_RDX;
  long in_RSI;
  Geodesic *in_RDI;
  __type _Var7;
  Geodesic newGeo;
  size_t i_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_000000f0;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *in_stack_000000f8;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *in_stack_00000100;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> eic;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *l2nm;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *t2_edges;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *t1_edges;
  vector<PhyloTree,_std::allocator<PhyloTree>_> bTreesNoCommonEdges;
  vector<PhyloTree,_std::allocator<PhyloTree>_> aTreesNoCommonEdges;
  size_t i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *chk_leaf_num_map;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *ref_leaf_num_map;
  vector<double,_std::allocator<double>_> *t2_leaf_lengths;
  vector<double,_std::allocator<double>_> *t1_leaf_lengths;
  double leafContributionSquared;
  Geodesic *geo;
  PhyloTree *in_stack_00000300;
  PhyloTree *in_stack_00000308;
  undefined4 in_stack_fffffffffffffe18;
  int in_stack_fffffffffffffe1c;
  Geodesic *in_stack_fffffffffffffe20;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *in_stack_fffffffffffffe30;
  vector<PhyloTree,_std::allocator<PhyloTree>_> *this;
  RatioSequence *in_stack_fffffffffffffe38;
  Geodesic *in_stack_fffffffffffffe40;
  reference in_stack_fffffffffffffe68;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *this_00;
  Geodesic local_140;
  vector<PhyloTree,_std::allocator<PhyloTree>_> *local_100;
  RatioSequence *in_stack_ffffffffffffff20;
  RatioSequence *in_stack_ffffffffffffff28;
  vector<PhyloTree,_std::allocator<PhyloTree>_> local_b0;
  vector<PhyloTree,_std::allocator<PhyloTree>_> local_98;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_70;
  byte local_31;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *t1_edges_00;
  
  t1_edges_00 = (vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)0x0;
  t2_edges_00 = (vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)(in_RSI + 0x50);
  dest = (vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)(in_RDX + 0x50);
  local_31 = 0;
  RatioSequence::RatioSequence((RatioSequence *)0x1ce05d);
  Geodesic(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  RatioSequence::~RatioSequence((RatioSequence *)0x1ce07e);
  local_70 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(in_RSI + 0x38);
  local_78 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(in_RDX + 0x38);
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(local_70);
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(local_78);
  if (sVar2 != sVar3) {
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar4,"Error getting geodesic: trees do not have the same number of leaves");
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_80 = (vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)0x0;
  while( true ) {
    this_00 = local_80;
    pvVar5 = (vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size(local_70);
    if (pvVar5 <= this_00) {
      setLeafContributionSquared(in_RDI,(double)t1_edges_00);
      std::vector<PhyloTree,_std::allocator<PhyloTree>_>::vector
                ((vector<PhyloTree,_std::allocator<PhyloTree>_> *)0x1ce2fe);
      std::vector<PhyloTree,_std::allocator<PhyloTree>_>::vector
                ((vector<PhyloTree,_std::allocator<PhyloTree>_> *)0x1ce310);
      splitOnCommonEdge(in_stack_00000100,in_stack_000000f8,in_stack_000000f0,
                        (vector<PhyloTree,_std::allocator<PhyloTree>_> *)i_1,
                        (vector<PhyloTree,_std::allocator<PhyloTree>_> *)
                        newGeo.leafContributionSquared);
      std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::vector
                ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)0x1ce387);
      PhyloTree::getCommonEdges(t1_edges_00,t2_edges_00,dest);
      std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::vector
                (this_00,(vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                         in_stack_fffffffffffffe68);
      setCommonEdges(in_stack_fffffffffffffe20,
                     (vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                     CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
      std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector(in_stack_fffffffffffffe30)
      ;
      local_100 = (vector<PhyloTree,_std::allocator<PhyloTree>_> *)0x0;
      while( true ) {
        this = local_100;
        pvVar6 = (vector<PhyloTree,_std::allocator<PhyloTree>_> *)
                 std::vector<PhyloTree,_std::allocator<PhyloTree>_>::size(&local_98);
        if (pvVar6 <= this) break;
        std::vector<PhyloTree,_std::allocator<PhyloTree>_>::operator[]
                  (&local_98,(size_type)local_100);
        std::vector<PhyloTree,_std::allocator<PhyloTree>_>::operator[]
                  (&local_b0,(size_type)local_100);
        getGeodesicNoCommonEdges(in_stack_00000308,in_stack_00000300);
        in_stack_fffffffffffffe20 = (Geodesic *)getRS(in_RDI);
        getRS(&local_140);
        RatioSequence::interleave(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
        setRS(in_stack_fffffffffffffe20,
              (RatioSequence *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
        RatioSequence::~RatioSequence((RatioSequence *)0x1ce4aa);
        ~Geodesic(in_stack_fffffffffffffe20);
        local_100 = (vector<PhyloTree,_std::allocator<PhyloTree>_> *)
                    ((long)&(local_100->super__Vector_base<PhyloTree,_std::allocator<PhyloTree>_>).
                            _M_impl.super__Vector_impl_data._M_start + 1);
      }
      local_31 = 1;
      std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector
                ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)this);
      std::vector<PhyloTree,_std::allocator<PhyloTree>_>::~vector(this);
      std::vector<PhyloTree,_std::allocator<PhyloTree>_>::~vector(this);
      if ((local_31 & 1) == 0) {
        ~Geodesic(in_stack_fffffffffffffe20);
      }
      return in_RDI;
    }
    in_stack_fffffffffffffe68 =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::operator[](local_70,(size_type)local_80);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](local_78,(size_type)local_80);
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffe20,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
    if (bVar1) break;
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)t2_edges_00,(size_type)local_80);
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)dest,(size_type)local_80);
    _Var7 = std::pow<double,int>((double)in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c);
    t1_edges_00 = (vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                  (_Var7 + (double)t1_edges_00);
    local_80 = (vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
               ((long)&(local_80->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)
                       ._M_impl.super__Vector_impl_data._M_start + 1);
  }
  piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument
            (piVar4,"Error getting geodesic: trees do not have the same sets of leaves");
  __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Geodesic Geodesic::getGeodesic(PhyloTree &t1, PhyloTree &t2) {
    double leafContributionSquared = 0;
    vector<double>& t1_leaf_lengths = t1.leafEdgeLengths;
    vector<double>& t2_leaf_lengths = t2.leafEdgeLengths;
    Geodesic geo = Geodesic(RatioSequence());

    // get the leaf contributions
    auto& ref_leaf_num_map = t1.leaf2NumMap;
    auto& chk_leaf_num_map = t2.leaf2NumMap;
    if (ref_leaf_num_map.size() != chk_leaf_num_map.size()) {
        throw invalid_argument("Error getting geodesic: trees do not have the same number of leaves");
    }
    for (size_t i = 0; i < ref_leaf_num_map.size(); i++) {
        if (ref_leaf_num_map[i] != chk_leaf_num_map[i]) {
            throw invalid_argument("Error getting geodesic: trees do not have the same sets of leaves");
        }
        leafContributionSquared += pow(t1_leaf_lengths[i] - t2_leaf_lengths[i], 2);
    }
    geo.setLeafContributionSquared(leafContributionSquared);

    vector<PhyloTree> aTreesNoCommonEdges;
    vector<PhyloTree> bTreesNoCommonEdges;

    // get the pairs of trees with no common edges put into aTreesNoCommonEdges and bTreesNoCommonEdges
    //  aTreesNoCommonEdges[i] goes with bTreesNoCommonEdges[i]
    auto& t1_edges = t1.edges;
    auto& t2_edges = t2.edges;
    auto& l2nm = t1.leaf2NumMap;
    splitOnCommonEdge(t1_edges, t2_edges, l2nm, aTreesNoCommonEdges, bTreesNoCommonEdges);
//    splitOnCommonEdge(t1, t2, aTreesNoCommonEdges, bTreesNoCommonEdges);
    //set the common edges
    vector<PhyloTreeEdge> eic;
    PhyloTree::getCommonEdges(t1_edges, t2_edges, eic);
    geo.setCommonEdges(eic);

    // find the geodesic between each pair of subtrees found by removing the common edges
    for (size_t i = 0; i < aTreesNoCommonEdges.size(); i++) {
        Geodesic newGeo = getGeodesicNoCommonEdges(aTreesNoCommonEdges[i], bTreesNoCommonEdges[i]);
        geo.setRS(RatioSequence::interleave(geo.getRS(), newGeo.getRS()));
    }
    return geo;
}